

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cpp
# Opt level: O0

list<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
StackTrace::make_trace_abi_cxx11_
          (list<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          StackTrace *this,pair<unsigned_long,_unsigned_long> *data)

{
  vertex_bundled *__x;
  StackTrace *g_;
  reference local_78;
  undefined1 local_60 [8];
  pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>_>
  edge;
  boost *local_30;
  vertex_descriptor act_item;
  pair<unsigned_long,_unsigned_long> *data_local;
  StackTrace *this_local;
  list<unsigned_long,_std::allocator<unsigned_long>_> *this_stack;
  
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list(__return_storage_ptr__);
  local_30 = (boost *)data->second;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
            (__return_storage_ptr__,&data->first);
  while (local_30 != (boost *)this->_root) {
    g_ = this;
    __x = boost::
          adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>
          ::operator[](&this->_local_stack,(vertex_descriptor)local_30);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_front
              (__return_storage_ptr__,&__x->addr);
    boost::
    out_edges<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config,boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>::config>>
              ((pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>_>
                *)local_60,local_30,(vertex_descriptor)&this->_local_stack,
               (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::bidirectional_graph_helper_with_property<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::bidirectionalS,_StackTrace::VertexProperty,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                *)g_);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long,_false,_false>
    ::operator*(&local_78,
                (iterator_facade_base<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_*,_std::vector<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>,_std::allocator<boost::detail::stored_edge_iter<unsigned_long,_std::_List_iterator<boost::list_edge<unsigned_long,_boost::no_property>_>,_boost::no_property>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long>,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_boost::iterators::random_access_traversal_tag,_boost::detail::edge_desc_impl<boost::bidirectional_tag,_unsigned_long>,_long,_false,_false>
                 *)local_60);
    local_30 = (boost *)boost::
                        target<boost::bidirectional_tag,unsigned_long,boost::vecS,boost::vecS,boost::bidirectionalS,StackTrace::VertexProperty,boost::no_property,boost::no_property,boost::listS>
                                  (&local_78.
                                    super_edge_base<boost::bidirectional_tag,_unsigned_long>,
                                   &this->_local_stack);
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<size_t> StackTrace::make_trace(
    const std::pair<size_t, StackTree::vertex_descriptor>& data) const {
  std::list<size_t> this_stack;

  StackTree::vertex_descriptor act_item = data.second;

  this_stack.push_front(data.first);
  while ((act_item != _root)) {
    this_stack.push_front(_local_stack[act_item].addr);
    // we are not root, hence we have edges per-definition
    const auto edge = boost::out_edges(act_item, _local_stack);
    act_item = boost::target(*(edge.first), _local_stack);
  }

  return this_stack;
}